

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanceid.c
# Opt level: O3

void * lyplg_type_print_instanceid
                 (ly_ctx *ctx,lyd_value *value,LY_VALUE_FORMAT format,void *prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  char *__s;
  LY_ERR LVar1;
  size_t sVar2;
  ly_path *path;
  ly_path *p;
  char *ret;
  ly_err_item *err;
  ly_path *local_48;
  char *local_40;
  ly_err_item *local_38;
  
  local_40 = (char *)0x0;
  local_48 = (ly_path *)0x0;
  if ((format < LY_VALUE_STR_NS) && ((0x31U >> (format & 0x1f) & 1) != 0)) {
    if (dynamic != (ly_bool *)0x0) {
      *dynamic = '\0';
    }
    if (value_len != (size_t *)0x0) {
      sVar2 = strlen(value->_canonical);
      *value_len = sVar2;
    }
    goto LAB_001bab96;
  }
  path = (value->field_2).target;
  if ((value->field_2).target == (ly_path *)0x0) {
    __s = value->_canonical;
    sVar2 = strlen(__s);
    LVar1 = lyplg_type_lypath_new
                      (ctx,__s,sVar2,0,LY_VALUE_JSON,(void *)0x0,(lysc_node *)0x0,
                       (lys_glob_unres *)0x0,&local_48,&local_38);
    path = local_48;
    if (LVar1 == LY_SUCCESS) goto LAB_001baafc;
    if (local_38 != (ly_err_item *)0x0) {
      ly_err_print(ctx,local_38);
      ly_err_free(local_38);
    }
  }
  else {
LAB_001baafc:
    LVar1 = instanceid_path2str(path,format,prefix_data,&local_40);
    if ((LVar1 == LY_SUCCESS) && (*dynamic = '\x01', value_len != (size_t *)0x0)) {
      sVar2 = strlen(local_40);
      *value_len = sVar2;
    }
  }
  ly_path_free(local_48);
  value = (lyd_value *)&local_40;
LAB_001bab96:
  return value->_canonical;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_instanceid(const struct ly_ctx *ctx, const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *prefix_data, ly_bool *dynamic, size_t *value_len)
{
    char *ret = NULL;
    struct ly_path *p = NULL;
    const struct ly_path *target;
    struct ly_err_item *err;

    if ((format == LY_VALUE_CANON) || (format == LY_VALUE_JSON) || (format == LY_VALUE_LYB)) {
        if (dynamic) {
            *dynamic = 0;
        }
        if (value_len) {
            *value_len = strlen(value->_canonical);
        }
        return value->_canonical;
    }

    if (!value->target) {
        /* schema default value, compile it first */
        if (lyplg_type_lypath_new(ctx, value->_canonical, strlen(value->_canonical), 0, LY_VALUE_JSON, NULL, NULL,
                NULL, &p, &err)) {
            if (err) {
                ly_err_print(ctx, err);
                ly_err_free(err);
            }
            goto cleanup;
        }

        target = p;
    } else {
        target = value->target;
    }

    /* print the value in the specific format */
    if (instanceid_path2str(target, format, prefix_data, &ret)) {
        goto cleanup;
    }

    *dynamic = 1;
    if (value_len) {
        *value_len = strlen(ret);
    }

cleanup:
    ly_path_free(p);
    return ret;
}